

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chkder_.c
# Opt level: O0

void chkder_(int *m,int *n,double *x,double *fvec,double *fjac,int *ldfjac,double *xp,double *fvecp,
            int *mode,double *err)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long in_RCX;
  long in_RDX;
  int *in_RSI;
  int *in_RDI;
  long in_R8;
  int *in_R9;
  double __x;
  double __x_00;
  double dVar6;
  double dVar7;
  double epslog;
  double epsmch;
  double temp;
  double epsf;
  double eps;
  int j;
  int i__;
  int i__2;
  int i__1;
  int fjac_offset;
  int fjac_dim1;
  int c__1;
  double local_68;
  int local_4c;
  int local_48;
  int local_34 [3];
  long local_28;
  long local_20;
  long local_18;
  int *local_10;
  int *local_8;
  
  local_34[0] = 1;
  lVar4 = (long)eps + -8;
  lVar5 = (long)temp + -8;
  local_20 = in_RCX + -8;
  local_18 = in_RDX + -8;
  iVar1 = *in_R9;
  local_28 = in_R8 + (long)(iVar1 + 1) * -8;
  local_10 = in_RSI;
  local_8 = in_RDI;
  __x = dpmpar_(local_34);
  __x_00 = sqrt(__x);
  if (*(int *)epsf == 2) {
    dVar6 = log(__x_00);
    iVar2 = *local_8;
    for (local_48 = 1; local_48 <= iVar2; local_48 = local_48 + 1) {
      *(undefined8 *)(lVar4 + (long)local_48 * 8) = 0;
    }
    iVar2 = *local_10;
    for (local_4c = 1; local_4c <= iVar2; local_4c = local_4c + 1) {
      local_68 = ABS(*(double *)(local_18 + (long)local_4c * 8));
      if ((local_68 == 0.0) && (!NAN(local_68))) {
        local_68 = 1.0;
      }
      iVar3 = *local_8;
      for (local_48 = 1; local_48 <= iVar3; local_48 = local_48 + 1) {
        *(double *)(lVar4 + (long)local_48 * 8) =
             local_68 * *(double *)(local_28 + (long)(local_48 + local_4c * iVar1) * 8) +
             *(double *)(lVar4 + (long)local_48 * 8);
      }
    }
    iVar1 = *local_8;
    for (local_48 = 1; local_48 <= iVar1; local_48 = local_48 + 1) {
      local_68 = 1.0;
      dVar7 = *(double *)(local_20 + (long)local_48 * 8);
      if ((((dVar7 != 0.0) || (NAN(dVar7))) &&
          ((dVar7 = *(double *)(lVar5 + (long)local_48 * 8), dVar7 != 0.0 || (NAN(dVar7))))) &&
         (__x * 100.0 * ABS(*(double *)(local_20 + (long)local_48 * 8)) <=
          ABS(*(double *)(lVar5 + (long)local_48 * 8) - *(double *)(local_20 + (long)local_48 * 8)))
         ) {
        local_68 = (__x_00 * ABS((*(double *)(lVar5 + (long)local_48 * 8) -
                                 *(double *)(local_20 + (long)local_48 * 8)) / __x_00 -
                                 *(double *)(lVar4 + (long)local_48 * 8))) /
                   (ABS(*(double *)(local_20 + (long)local_48 * 8)) +
                   ABS(*(double *)(lVar5 + (long)local_48 * 8)));
      }
      *(undefined8 *)(lVar4 + (long)local_48 * 8) = 0x3ff0000000000000;
      if ((__x < local_68) && (local_68 < __x_00)) {
        dVar7 = log(local_68);
        *(double *)(lVar4 + (long)local_48 * 8) =
             (dVar7 * 0.4342944819032518 + -(dVar6 * 0.4342944819032518)) /
             (dVar6 * 0.4342944819032518);
      }
      if (__x_00 <= local_68) {
        *(undefined8 *)(lVar4 + (long)local_48 * 8) = 0;
      }
    }
  }
  else {
    iVar1 = *local_10;
    for (local_4c = 1; local_4c <= iVar1; local_4c = local_4c + 1) {
      local_68 = __x_00 * ABS(*(double *)(local_18 + (long)local_4c * 8));
      if ((local_68 == 0.0) && (!NAN(local_68))) {
        local_68 = __x_00;
      }
      *(double *)((long)epsmch + -8 + (long)local_4c * 8) =
           *(double *)(local_18 + (long)local_4c * 8) + local_68;
    }
  }
  return;
}

Assistant:

__minpack_attr__
void __minpack_func__(chkder)(const int *m, const int *n, const real *x, 
	real *fvec, real *fjac, const int *ldfjac, real *xp, 
	real *fvecp, const int *mode, real *err)
{
    /* Initialized data */

    const int c__1 = 1;

    /* System generated locals */
    int fjac_dim1, fjac_offset, i__1, i__2;

    /* Local variables */
    int i__, j;
    real eps, epsf, temp, epsmch;
    real epslog;

/*     ********** */

/*     subroutine chkder */

/*     this subroutine checks the gradients of m nonlinear functions */
/*     in n variables, evaluated at a point x, for consistency with */
/*     the functions themselves. the user must call chkder twice, */
/*     first with mode = 1 and then with mode = 2. */

/*     mode = 1. on input, x must contain the point of evaluation. */
/*               on output, xp is set to a neighboring point. */

/*     mode = 2. on input, fvec must contain the functions and the */
/*                         rows of fjac must contain the gradients */
/*                         of the respective functions each evaluated */
/*                         at x, and fvecp must contain the functions */
/*                         evaluated at xp. */
/*               on output, err contains measures of correctness of */
/*                          the respective gradients. */

/*     the subroutine does not perform reliably if cancellation or */
/*     rounding errors cause a severe loss of significance in the */
/*     evaluation of a function. therefore, none of the components */
/*     of x should be unusually small (in particular, zero) or any */
/*     other value which may cause loss of significance. */

/*     the subroutine statement is */

/*       subroutine chkder(m,n,x,fvec,fjac,ldfjac,xp,fvecp,mode,err) */

/*     where */

/*       m is a positive integer input variable set to the number */
/*         of functions. */

/*       n is a positive integer input variable set to the number */
/*         of variables. */

/*       x is an input array of length n. */

/*       fvec is an array of length m. on input when mode = 2, */
/*         fvec must contain the functions evaluated at x. */

/*       fjac is an m by n array. on input when mode = 2, */
/*         the rows of fjac must contain the gradients of */
/*         the respective functions evaluated at x. */

/*       ldfjac is a positive integer input parameter not less than m */
/*         which specifies the leading dimension of the array fjac. */

/*       xp is an array of length n. on output when mode = 1, */
/*         xp is set to a neighboring point of x. */

/*       fvecp is an array of length m. on input when mode = 2, */
/*         fvecp must contain the functions evaluated at xp. */

/*       mode is an integer input variable set to 1 on the first call */
/*         and 2 on the second. other values of mode are equivalent */
/*         to mode = 1. */

/*       err is an array of length m. on output when mode = 2, */
/*         err contains measures of correctness of the respective */
/*         gradients. if there is no severe loss of significance, */
/*         then if err(i) is 1.0 the i-th gradient is correct, */
/*         while if err(i) is 0.0 the i-th gradient is incorrect. */
/*         for values of err between 0.0 and 1.0, the categorization */
/*         is less certain. in general, a value of err(i) greater */
/*         than 0.5 indicates that the i-th gradient is probably */
/*         correct, while a value of err(i) less than 0.5 indicates */
/*         that the i-th gradient is probably incorrect. */

/*     subprograms called */

/*       minpack supplied ... dpmpar */

/*       fortran supplied ... dabs,dlog10,dsqrt */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */
    /* Parameter adjustments */
    --err;
    --fvecp;
    --fvec;
    --xp;
    --x;
    fjac_dim1 = *ldfjac;
    fjac_offset = 1 + fjac_dim1 * 1;
    fjac -= fjac_offset;

    /* Function Body */

/*     epsmch is the machine precision. */

    epsmch = __minpack_func__(dpmpar)(&c__1);

    eps = sqrt(epsmch);

    if (*mode == 2) {
	goto L20;
    }

/*        mode = 1. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	temp = eps * fabs(x[j]);
	if (temp == 0.) {
	    temp = eps;
	}
	xp[j] = x[j] + temp;
/* L10: */
    }
    /* goto L70; */
    return;
L20:

/*        mode = 2. */

    epsf = factor * epsmch;
    epslog = log10e * log(eps);
    i__1 = *m;
    for (i__ = 1; i__ <= i__1; ++i__) {
	err[i__] = 0.;
/* L30: */
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	temp = fabs(x[j]);
	if (temp == 0.) {
	    temp = 1.;
	}
	i__2 = *m;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    err[i__] += temp * fjac[i__ + j * fjac_dim1];
/* L40: */
	}
/* L50: */
    }
    i__1 = *m;
    for (i__ = 1; i__ <= i__1; ++i__) {
	temp = 1.;
	if (fvec[i__] != 0. && fvecp[i__] != 0. && fabs(fvecp[i__] - 
		fvec[i__]) >= epsf * fabs(fvec[i__]))
		 {
	    temp = eps * fabs((fvecp[i__] - fvec[i__]) / eps - err[i__]) 
		    / (fabs(fvec[i__]) +
                       fabs(fvecp[i__]));
	}
	err[i__] = 1.;
	if (temp > epsmch && temp < eps) {
	    err[i__] = (log10e * log(temp) - epslog) / epslog;
	}
	if (temp >= eps) {
	    err[i__] = 0.;
	}
/* L60: */
    }
/* L70: */

    /* return 0; */

/*     last card of subroutine chkder. */

}